

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O1

int os_file_names_equal(char *a,char *b)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *p;
  ulong uVar4;
  char *p_00;
  bool bVar5;
  size_t lenb;
  size_t lena;
  size_t local_40;
  size_t local_38;
  
  sVar2 = strlen(a);
  p_00 = a + sVar2;
  uVar3 = strlen(b);
  p = b + uVar3;
  do {
    uVar4 = uVar3 & 0xffffffff;
    p_00 = prev_path_ele(a,p_00,&local_38);
    p = prev_path_ele(b,p,&local_40);
    if (p == (char *)0x0 || p_00 == (char *)0x0) {
      bVar5 = false;
      uVar3 = (ulong)(p_00 == p);
    }
    else {
      bVar5 = false;
      uVar3 = 0;
      if (local_38 == local_40) {
        iVar1 = bcmp(p_00,p,local_38);
        bVar5 = iVar1 == 0;
        uVar3 = uVar4;
        if (!bVar5) {
          uVar3 = 0;
        }
      }
    }
  } while (bVar5);
  return (int)uVar3;
}

Assistant:

int os_file_names_equal(const char *a, const char *b)
{
    /* start at the end of each name and work backwards */
    const char *pa = a + strlen(a), *pb = b + strlen(b);

    /* keep going until we reach the start of one or the other path */
    for (;;)
    {
        size_t lena, lenb;

        /* get the next earlier element of each path */
        pa = prev_path_ele(a, pa, &lena);
        pb = prev_path_ele(b, pb, &lenb);

        /* if one or the other ran out, we're done */
        if (pa == 0 || pb == 0)
        {
            /* the paths match if they ran out at the same time */
            return pa == pb;
        }

        /* if the two elements don't match, return unequal */
        if (lena != lenb || fname_memcmp(pa, pb, lena) != 0)
            return FALSE;
    }
}